

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::LoadCache(cmake *this,string *path,bool internal,
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *excludes,
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *includes)

{
  char *__s;
  pointer this_00;
  allocator<char> local_79;
  string local_78;
  const_iterator local_58;
  char **entry;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psStack_30;
  bool result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *excludes_local;
  string *psStack_18;
  bool internal_local;
  string *path_local;
  cmake *this_local;
  
  psStack_30 = includes;
  includes_local = excludes;
  excludes_local._7_1_ = internal;
  psStack_18 = path;
  path_local = (string *)this;
  this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  __range1._7_1_ =
       cmState::LoadCache(this_00,psStack_18,(bool)(excludes_local._7_1_ & 1),includes_local,
                          psStack_30);
  __begin1 = (const_iterator)&LoadCache::entries;
  __end1 = std::initializer_list<const_char_*>::begin(&LoadCache::entries);
  entry = std::initializer_list<const_char_*>::end(&LoadCache::entries);
  for (; __end1 != entry; __end1 = __end1 + 1) {
    local_58 = __end1;
    __s = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
    UnwatchUnusedCli(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return (bool)(__range1._7_1_ & 1);
}

Assistant:

bool cmake::LoadCache(const std::string& path, bool internal,
                      std::set<std::string>& excludes,
                      std::set<std::string>& includes)
{
  bool result = this->State->LoadCache(path, internal, excludes, includes);
  static const auto entries = { "CMAKE_CACHE_MAJOR_VERSION",
                                "CMAKE_CACHE_MINOR_VERSION" };
  for (auto const& entry : entries) {
    this->UnwatchUnusedCli(entry);
  }
  return result;
}